

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O2

void __thiscall hrgls::Message::Message(Message *this,Message *copy)

{
  Message_private *pMVar1;
  hrgls_Status hVar2;
  Message_private *pMVar3;
  hrgls_Message phVar4;
  
  this->m_private = (Message_private *)0x0;
  pMVar3 = (Message_private *)operator_new(0x10);
  pMVar3->Message = (hrgls_Message)0x0;
  *(undefined8 *)&pMVar3->status = 0;
  this->m_private = pMVar3;
  pMVar1 = copy->m_private;
  phVar4 = (hrgls_Message)0x0;
  if (pMVar1 != (Message_private *)0x0) {
    phVar4 = pMVar1->Message;
    hVar2 = 0;
    if (phVar4 == (hrgls_Message)0x0) {
      hVar2 = 0x3ee;
    }
    pMVar1->status = hVar2;
  }
  hVar2 = hrgls_MessageCopy(pMVar3,phVar4);
  this->m_private->status = hVar2;
  return;
}

Assistant:

Message::Message(const Message &copy)
  {
    m_private = new Message_private();
    m_private->status = hrgls_MessageCopy(&m_private->Message, copy.RawMessage());
  }